

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cubeb_resampler_internal.h
# Opt level: O2

uint32_t __thiscall
cubeb_resampler_speex_one_way<float>::latency(cubeb_resampler_speex_one_way<float> *this)

{
  int iVar1;
  
  iVar1 = speex_resampler_get_output_latency(this->speex_resampler);
  return iVar1 + this->additional_latency;
}

Assistant:

uint32_t latency() const
  {
    /* The documentation of the resampler talks about "samples" here, but it
     * only consider a single channel here so it's the same number of frames. */
    int latency = 0;

    latency = speex_resampler_get_output_latency(speex_resampler) +
              additional_latency;

    assert(latency >= 0);

    return latency;
  }